

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall UrsaClient::setup_connection(UrsaClient *this)

{
  socket_t *in_RDI;
  anon_class_8_1_8991fb9c make_socket;
  socket_t *in_stack_00000158;
  UrsaClient *in_stack_00000160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string_view_t in_stack_ffffffffffffffc8;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffe8;
  
  if (((ulong)in_RDI[2].super_socket_base._handle & 1) != 0) {
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffffc0,(char *)in_RDI);
    spdlog::info<std::__cxx11::string>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  setup_connection::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffffe8);
  zmq::socket_t::operator=((socket_t *)in_stack_ffffffffffffffc0,in_RDI);
  zmq::socket_t::~socket_t((socket_t *)0x120cfc);
  check_conn_status(in_stack_00000160,in_stack_00000158);
  setup_connection::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffffe8);
  zmq::socket_t::operator=((socket_t *)in_stack_ffffffffffffffc0,in_RDI);
  zmq::socket_t::~socket_t((socket_t *)0x120d3a);
  return;
}

Assistant:

void UrsaClient::setup_connection() {
    auto make_socket = [this]() {
        zmq::socket_t socket(context, ZMQ_REQ);
        socket.setsockopt(ZMQ_LINGER, 0);
        socket.setsockopt(ZMQ_RCVTIMEO, 1000);
        socket.connect(server_addr);
        return socket;
    };

    if (is_interactive) {
        spdlog::info("Connecting to {}", server_addr);
    }
    cmd_socket = make_socket();
    check_conn_status(&cmd_socket);
    status_socket = make_socket();
}